

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O3

void exclusion_from_file(archive *m)

{
  wchar_t wVar1;
  archive_entry *entry;
  
  entry = archive_entry_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'w',(uint)(entry != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    archive_entry_copy_pathname(entry,"first");
    failure("\'first\' should not be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x7f',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x80',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_clear(entry);
    archive_entry_copy_pathname_w(entry,anon_var_dwarf_10422);
    failure("\'first\' should not be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x84',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x85',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_copy_pathname(entry,"second");
    failure("\'second\' should be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x8a',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x8b',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_clear(entry);
    archive_entry_copy_pathname_w(entry,anon_var_dwarf_10440);
    failure("\'second\' should be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x8f',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x90',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_copy_pathname(entry,"third");
    failure("\'third\' should not be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x95',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x96',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_clear(entry);
    archive_entry_copy_pathname_w(entry,anon_var_dwarf_1045e);
    failure("\'third\' should not be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x9a',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\x9b',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_copy_pathname(entry,"four");
    failure("\'four\' should be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'\xa0',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
    ;
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'¡',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_clear(entry);
    archive_entry_copy_pathname_w(entry,anon_var_dwarf_10488);
    failure("\'four\' should be excluded");
    wVar1 = archive_match_path_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'¥',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0);
    wVar1 = archive_match_excluded(m,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'¦',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
    archive_entry_free(entry);
    return;
  }
  archive_match_free(m);
  return;
}

Assistant:

static void
exclusion_from_file(struct archive *m)
{
	struct archive_entry *ae;

	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	/* Test with 'first', which should not be excluded. */
	archive_entry_copy_pathname(ae, "first");
	failure("'first' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"first");
	failure("'first' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	/* Test with 'second', which should be excluded. */
	archive_entry_copy_pathname(ae, "second");
	failure("'second' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"second");
	failure("'second' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Test with 'third', which should not be excluded. */
	archive_entry_copy_pathname(ae, "third");
	failure("'third' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"third");
	failure("'third' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	/* Test with 'four', which should be excluded. */
	archive_entry_copy_pathname(ae, "four");
	failure("'four' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"four");
	failure("'four' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_entry_free(ae);
}